

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O0

void __thiscall zmq::stream_engine_base_t::timer_event(stream_engine_base_t *this,int id_)

{
  int in_ESI;
  long *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 0x40) {
    *(undefined1 *)(in_RDI + 0xb8) = 0;
    (**(code **)(*in_RDI + 0x60))(in_RDI,2);
  }
  else if (in_ESI == 0x80) {
    in_RDI[0xaa] = 0;
    in_RDI[0xa9] = 0x89;
    (**(code **)(*in_RDI + 0x18))();
    io_object_t::add_timer
              ((io_object_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  else if (in_ESI == 0x82) {
    *(undefined1 *)((long)in_RDI + 0x5c1) = 0;
    (**(code **)(*in_RDI + 0x60))(in_RDI,2);
  }
  else if (in_ESI == 0x81) {
    *(undefined1 *)((long)in_RDI + 0x5c2) = 0;
    (**(code **)(*in_RDI + 0x60))(in_RDI,2);
  }
  return;
}

Assistant:

void zmq::stream_engine_base_t::timer_event (int id_)
{
    if (id_ == handshake_timer_id) {
        _has_handshake_timer = false;
        //  handshake timer expired before handshake completed, so engine fail
        error (timeout_error);
    } else if (id_ == heartbeat_ivl_timer_id) {
        _next_msg = &stream_engine_base_t::produce_ping_message;
        out_event ();
        add_timer (_options.heartbeat_interval, heartbeat_ivl_timer_id);
    } else if (id_ == heartbeat_ttl_timer_id) {
        _has_ttl_timer = false;
        error (timeout_error);
    } else if (id_ == heartbeat_timeout_timer_id) {
        _has_timeout_timer = false;
        error (timeout_error);
    } else
        // There are no other valid timer ids!
        assert (false);
}